

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O1

void __thiscall
wasm::BinaryInstWriter::visitStringMeasure(BinaryInstWriter *this,StringMeasure *curr)

{
  size_t in_RCX;
  void *__buf;
  int __fd;
  LEB<unsigned_int,_unsigned_char> *this_00;
  LEB<unsigned_int,_unsigned_char> local_24;
  LEB<unsigned_int,_unsigned_char> local_20;
  uchar local_19;
  
  local_19 = 0xfb;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,&local_19);
  if (curr->op == StringMeasureWTF16) {
    __fd = (int)this->o;
    this_00 = &local_24;
    local_24.value = 0x85;
  }
  else {
    if (curr->op != StringMeasureUTF8) {
      handle_unreachable("invalid string.new*",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack.cpp"
                         ,0xa0d);
    }
    __fd = (int)this->o;
    this_00 = &local_20;
    local_20.value = 0x83;
  }
  LEB<unsigned_int,_unsigned_char>::write(this_00,__fd,__buf,in_RCX);
  return;
}

Assistant:

void BinaryInstWriter::visitStringMeasure(StringMeasure* curr) {
  o << int8_t(BinaryConsts::GCPrefix);
  switch (curr->op) {
    case StringMeasureUTF8:
      o << U32LEB(BinaryConsts::StringMeasureUTF8);
      break;
    case StringMeasureWTF16:
      o << U32LEB(BinaryConsts::StringMeasureWTF16);
      break;
    default:
      WASM_UNREACHABLE("invalid string.new*");
  }
}